

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O1

void mpack_discard(mpack_reader_t *reader)

{
  anon_union_8_8_6320e492_for_v aVar1;
  char *pcVar2;
  uint uVar3;
  size_t count;
  mpack_tag_t mVar4;
  
  mVar4 = mpack_read_tag(reader);
  aVar1 = mVar4.v;
  if (reader->error != mpack_ok) {
    return;
  }
  switch(mVar4.type) {
  case mpack_type_str:
  case mpack_type_bin:
    count = aVar1.u & 0xffffffff;
    if ((ulong)((long)reader->end - (long)reader->data) < count) {
LAB_00107b89:
      mpack_skip_bytes_straddle(reader,count);
      return;
    }
    pcVar2 = reader->data + count;
    goto LAB_00107bc6;
  case mpack_type_ext:
    count = aVar1.u >> 0x20;
    if ((ulong)((long)reader->end - (long)reader->data) < count) goto LAB_00107b89;
    pcVar2 = reader->data + count;
LAB_00107bc6:
    reader->data = pcVar2;
    break;
  case mpack_type_array:
    uVar3 = mVar4.v._0_4_;
    while ((uVar3 != 0 && (mpack_discard(reader), reader->error == mpack_ok))) {
      aVar1._0_4_ = aVar1.l - 1;
      aVar1.ext.length = 0;
      uVar3 = aVar1._0_4_;
    }
    break;
  case mpack_type_map:
    uVar3 = mVar4.v._0_4_;
    while (uVar3 != 0) {
      mpack_discard(reader);
      mpack_discard(reader);
      if (reader->error != mpack_ok) {
        return;
      }
      aVar1._0_4_ = aVar1.l - 1;
      aVar1.ext.length = 0;
      uVar3 = aVar1._0_4_;
    }
  }
  return;
}

Assistant:

void mpack_discard(mpack_reader_t* reader) {
    mpack_tag_t var = mpack_read_tag(reader);
    if (mpack_reader_error(reader))
        return;
    switch (var.type) {
        case mpack_type_str:
            mpack_skip_bytes(reader, var.v.l);
            mpack_done_str(reader);
            break;
        case mpack_type_bin:
            mpack_skip_bytes(reader, var.v.l);
            mpack_done_bin(reader);
            break;
        case mpack_type_ext:
            mpack_skip_bytes(reader, var.v.ext.length);
            mpack_done_ext(reader);
            break;
        case mpack_type_array: {
            for (; var.v.n > 0; --var.v.n) {
                mpack_discard(reader);
                if (mpack_reader_error(reader))
                    break;
            }
            mpack_done_array(reader);
            break;
        }
        case mpack_type_map: {
            for (; var.v.n > 0; --var.v.n) {
                mpack_discard(reader);
                mpack_discard(reader);
                if (mpack_reader_error(reader))
                    break;
            }
            mpack_done_map(reader);
            break;
        }
        default:
            break;
    }
}